

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O1

parse_return
msgpack::v2::detail::parse_imp<msgpack::v2::detail::create_object_visitor>
          (char *data,size_t len,size_t *off,create_object_visitor *v)

{
  parse_return pVar1;
  size_t noff;
  parse_helper<msgpack::v2::detail::create_object_visitor> h;
  ulong local_70;
  context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_> local_68;
  create_object_visitor *local_30;
  
  local_70 = *off;
  if (local_70 < len) {
    local_68.m_trail = 0;
    local_68.m_cs = 0;
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::
    unpack_stack::unpack_stack(&local_68.m_stack);
    local_30 = v;
    pVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::execute(&local_68,data,len,&local_70);
    if (pVar1 == PARSE_CONTINUE) {
      *off = local_70;
      pVar1 = PARSE_CONTINUE;
      create_object_visitor::insufficient_bytes(v,local_70 - 1,local_70);
    }
    else if (pVar1 == PARSE_SUCCESS) {
      *off = local_70;
      pVar1 = PARSE_SUCCESS - (uint)(local_70 < len);
    }
    if (local_68.m_stack.m_stack.
        super__Vector_base<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem,_std::allocator<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.m_stack.m_stack.
                      super__Vector_base<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem,_std::allocator<msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::unpack_stack::stack_elem>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    create_object_visitor::insufficient_bytes(v,local_70,local_70);
    pVar1 = PARSE_CONTINUE;
  }
  return pVar1;
}

Assistant:

inline parse_return
parse_imp(const char* data, size_t len, size_t& off, Visitor& v) {
    std::size_t noff = off;

    if(len <= noff) {
        // FIXME
        v.insufficient_bytes(noff, noff);
        return PARSE_CONTINUE;
    }
    detail::parse_helper<Visitor> h(v);
    parse_return ret = h.execute(data, len, noff);
    switch (ret) {
    case PARSE_CONTINUE:
        off = noff;
        v.insufficient_bytes(noff - 1, noff);
        return ret;
    case PARSE_SUCCESS:
        off = noff;
        if(noff < len) {
            return PARSE_EXTRA_BYTES;
        }
        return ret;
    default:
        return ret;
    }
}